

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

void __thiscall FIX::DataDictionary::checkValidTagNumber(DataDictionary *this,FieldBase *field)

{
  int iVar1;
  InvalidTagNumber *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  string local_48;
  
  iVar1 = field->m_tag;
  p_Var4 = &(this->m_fields)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var4->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < iVar1]) {
    if (iVar1 <= (int)p_Var3[1]._M_color) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var4->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var4) && (p_Var3 = p_Var2, iVar1 < (int)p_Var2[1]._M_color)) {
    p_Var3 = &p_Var4->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    return;
  }
  this_00 = (InvalidTagNumber *)__cxa_allocate_exception(0x58);
  iVar1 = field->m_tag;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  InvalidTagNumber::InvalidTagNumber(this_00,iVar1,&local_48);
  __cxa_throw(this_00,&InvalidTagNumber::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(InvalidTagNumber) {
    if (m_fields.find(field.getTag()) == m_fields.end()) {
      throw InvalidTagNumber(field.getTag());
    }
  }